

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_typed_array_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  long *plVar2;
  JSValueUnion JVar3;
  long lVar4;
  long *plVar5;
  JSValue v;
  
  plVar2 = *(long **)((long)val.u.ptr + 0x30);
  if (plVar2 != (long *)0x0) {
    JVar3 = (JSValueUnion)((JSValueUnion *)(plVar2 + 3))->ptr;
    if ((*(byte *)((long)JVar3.ptr + 5) & 2) == 0) {
      lVar4 = *plVar2;
      plVar5 = (long *)plVar2[1];
      *(long **)(lVar4 + 8) = plVar5;
      *plVar5 = lVar4;
      *plVar2 = 0;
      plVar2[1] = 0;
    }
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = -1;
      v.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v);
    }
    (*(rt->mf).js_free)(&rt->malloc_state,plVar2);
    return;
  }
  return;
}

Assistant:

static void js_typed_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JSTypedArray *ta = p->u.typed_array;
    if (ta) {
        /* during the GC the finalizers are called in an arbitrary
           order so the ArrayBuffer finalizer may have been called */
        if (JS_IsLiveObject(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer))) {
            list_del(&ta->link);
        }
        JS_FreeValueRT(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
        js_free_rt(rt, ta);
    }
}